

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowTabBar::~QMainWindowTabBar(QMainWindowTabBar *this)

{
  QMainWindow *pQVar1;
  QMainWindowLayout *pQVar2;
  long in_FS_OFFSET;
  QMainWindowTabBar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007cee48;
  *(undefined ***)(this + 0x10) = &PTR__QMainWindowTabBar_007cf028;
  pQVar1 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>(*(QObject **)(this + 0x28));
  if ((pQVar1 != (QMainWindow *)0x0) &&
     (*(QMainWindow **)(this + 0x28) != *(QMainWindow **)(*(long *)(this + 8) + 0x10))) {
    pQVar2 = qt_mainwindow_layout(*(QMainWindow **)(this + 0x28));
    if (pQVar2 != (QMainWindowLayout *)0x0) {
      local_28 = (QMainWindowTabBar *)this;
      QtPrivate::sequential_erase_one<QList<QTabBar*>,QMainWindowTabBar*>
                (&pQVar2->unusedTabBars,&local_28);
      local_28 = (QMainWindowTabBar *)this;
      QHash<QTabBar*,QHashDummyValue>::removeImpl<QTabBar*>
                ((QHash<QTabBar*,QHashDummyValue> *)&pQVar2->usedTabBars,(QTabBar **)&local_28);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)(this + 0x30));
  QTabBar::~QTabBar((QTabBar *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMainWindowTabBar::~QMainWindowTabBar()
{
    // Use qobject_cast to verify that we are not already in the (QWidget)
    // destructor of mainWindow
    if (!qobject_cast<QMainWindow *>(mainWindow) || mainWindow == parentWidget())
        return;

    // tab bar is not parented to the main window
    // => can only be a dock widget group window
    // => remove itself from used and unused tab bar containers
    auto *mwLayout = qt_mainwindow_layout(mainWindow);
    if (!mwLayout)
        return;
    mwLayout->unusedTabBars.removeOne(this);
    mwLayout->usedTabBars.remove(this);
}